

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall
FIX::Session::nextResendRequest(Session *this,Message *resendRequest,UtcTimeStamp *now)

{
  undefined **ppuVar1;
  SessionState *this_00;
  pointer pcVar2;
  int iVar3;
  FieldBase *pFVar4;
  IntTConvertor<unsigned_long> *pIVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint64_t uVar8;
  SEQNUM SVar9;
  uint64_t uVar10;
  long *plVar11;
  ulong *puVar12;
  unsigned_long value;
  unsigned_long value_00;
  ulong uVar13;
  undefined8 uVar14;
  uchar *in_R8;
  size_t in_R9;
  string beginString;
  MsgSeqNum msgSeqNum;
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  pthread_mutex_t *local_1a0;
  undefined1 local_198 [80];
  field_metrics local_148;
  string local_140;
  undefined1 local_120 [16];
  _Alloc_hider local_110;
  char local_100 [16];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  field_metrics local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  char local_68 [16];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  field_metrics local_38;
  
  iVar3 = verify(this,(EVP_PKEY_CTX *)resendRequest,(uchar *)0x0,0,in_R8,in_R9);
  if ((char)iVar3 == '\0') {
    return;
  }
  local_1a0 = (pthread_mutex_t *)&this->m_mutex;
  Mutex::lock((Mutex *)&local_1a0->__data);
  pFVar4 = FieldMap::getFieldRef(&resendRequest->super_FieldMap,7);
  local_88._0_8_ = &PTR__FieldBase_001f55c8;
  local_88._8_4_ = pFVar4->m_tag;
  local_78._M_p = local_68;
  pcVar2 = (pFVar4->m_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + (pFVar4->m_string)._M_string_length);
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38 = pFVar4->m_metrics;
  local_88._0_8_ = &PTR__FieldBase_001f7020;
  pFVar4 = FieldMap::getFieldRef(&resendRequest->super_FieldMap,0x10);
  local_120._0_8_ = &PTR__FieldBase_001f55c8;
  local_120._8_4_ = pFVar4->m_tag;
  local_110._M_p = local_100;
  pcVar2 = (pFVar4->m_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + (pFVar4->m_string)._M_string_length);
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0 = pFVar4->m_metrics;
  local_120._0_8_ = &PTR__FieldBase_001f6f78;
  pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_88);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_a8,pIVar5,value);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1cde66);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_b8 = *plVar11;
    lStack_b0 = plVar6[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar11;
    local_c8 = (long *)*plVar6;
  }
  local_c0 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_1c0 = &local_1b0;
  puVar12 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar12) {
    local_1b0 = *puVar12;
    lStack_1a8 = plVar6[3];
  }
  else {
    local_1b0 = *puVar12;
    local_1c0 = (ulong *)*plVar6;
  }
  local_1b8 = plVar6[1];
  *plVar6 = (long)puVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_120);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_140,pIVar5,value_00);
  uVar13 = 0xf;
  if (local_1c0 != &local_1b0) {
    uVar13 = local_1b0;
  }
  if (uVar13 < local_140._M_string_length + local_1b8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      uVar14 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_140._M_string_length + local_1b8) goto LAB_001a890c;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_1c0);
  }
  else {
LAB_001a890c:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_140._M_dataplus._M_p);
  }
  local_198._0_8_ = local_198 + 0x10;
  ppuVar1 = (undefined **)(puVar7 + 2);
  if ((undefined **)*puVar7 == ppuVar1) {
    local_198._16_8_ = *ppuVar1;
    local_198._24_8_ = puVar7[3];
  }
  else {
    local_198._16_8_ = *ppuVar1;
    local_198._0_8_ = (undefined **)*puVar7;
  }
  local_198._8_8_ = puVar7[1];
  *puVar7 = ppuVar1;
  this_00 = &this->m_state;
  puVar7[1] = 0;
  *(undefined1 *)ppuVar1 = 0;
  SessionState::onEvent(this_00,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_1c0 = &local_1b0;
  pcVar2 = (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string._M_dataplus.
           _M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar2,
             pcVar2 + (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)&local_1c0);
  if (((iVar3 < 0) || (uVar8 = UInt64Field::getValue((UInt64Field *)local_120), uVar8 != 0)) &&
     ((iVar3 = std::__cxx11::string::compare((char *)&local_1c0), 0 < iVar3 ||
      (uVar8 = UInt64Field::getValue((UInt64Field *)local_120), uVar8 != 999999)))) {
    uVar8 = UInt64Field::getValue((UInt64Field *)local_120);
    SVar9 = SessionState::getNextSenderMsgSeqNum(this_00);
    if (uVar8 < SVar9) goto LAB_001a8b0a;
  }
  SVar9 = SessionState::getNextSenderMsgSeqNum(this_00);
  UInt64Field::UInt64Field((UInt64Field *)local_198,0x10,SVar9 - 1);
  local_198._0_8_ = &PTR__FieldBase_001f6f78;
  local_120._8_4_ = local_198._8_4_;
  std::__cxx11::string::_M_assign((string *)&local_110);
  local_d0 = local_148;
  local_e8 = 0;
  *local_f0._M_p = '\0';
  FieldBase::~FieldBase((FieldBase *)local_198);
LAB_001a8b0a:
  if (this->m_persistMessages == false) {
    uVar8 = UInt64Field::getValue((UInt64Field *)local_120);
    UInt64Field::UInt64Field((UInt64Field *)local_198,0x10,uVar8 + 1);
    local_198._0_8_ = &PTR__FieldBase_001f6f78;
    local_120._8_4_ = local_198._8_4_;
    std::__cxx11::string::_M_assign((string *)&local_110);
    local_d0 = local_148;
    local_e8 = 0;
    *local_f0._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)local_198);
    SVar9 = SessionState::getNextSenderMsgSeqNum(this_00);
    uVar8 = UInt64Field::getValue((UInt64Field *)local_120);
    if (SVar9 < uVar8) {
      UInt64Field::UInt64Field((UInt64Field *)local_198,0x10,SVar9);
      local_198._0_8_ = &PTR__FieldBase_001f6f78;
      local_120._8_4_ = local_198._8_4_;
      std::__cxx11::string::_M_assign((string *)&local_110);
      local_d0 = local_148;
      local_e8 = 0;
      *local_f0._M_p = '\0';
      FieldBase::~FieldBase((FieldBase *)local_198);
    }
    uVar8 = UInt64Field::getValue((UInt64Field *)local_88);
    uVar10 = UInt64Field::getValue((UInt64Field *)local_120);
    generateSequenceReset(this,uVar8,uVar10);
  }
  else {
    uVar8 = UInt64Field::getValue((UInt64Field *)local_88);
    uVar10 = UInt64Field::getValue((UInt64Field *)local_120);
    generateRetransmits(this,uVar8,uVar10);
  }
  UInt64Field::UInt64Field((UInt64Field *)local_198,0x22,0);
  local_198._0_8_ = &PTR__FieldBase_001f6e60;
  FieldMap::getField(&(resendRequest->m_header).super_FieldMap,(FieldBase *)local_198);
  uVar8 = UInt64Field::getValue((UInt64Field *)local_198);
  SVar9 = SessionState::getNextTargetMsgSeqNum(this_00);
  if (uVar8 <= SVar9) {
    uVar8 = UInt64Field::getValue((UInt64Field *)local_198);
    SVar9 = SessionState::getNextTargetMsgSeqNum(this_00);
    if (SVar9 <= uVar8) {
      SessionState::incrNextTargetMsgSeqNum(this_00);
    }
  }
  FieldBase::~FieldBase((FieldBase *)local_198);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  FieldBase::~FieldBase((FieldBase *)local_120);
  FieldBase::~FieldBase((FieldBase *)local_88);
  iVar3 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar3 + -1;
  if (iVar3 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock(local_1a0);
  }
  return;
}

Assistant:

void Session::nextResendRequest(const Message &resendRequest, const UtcTimeStamp &now) {
  if (!verify(resendRequest, false, false)) {
    return;
  }

  Locker l(m_mutex);

  auto beginSeqNo = resendRequest.getField<BeginSeqNo>();
  auto endSeqNo = resendRequest.getField<EndSeqNo>();

  m_state.onEvent(
      "Received ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(beginSeqNo)
      + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

  std::string beginString = m_sessionID.getBeginString();
  if ((beginString >= FIX::BeginString_FIX42 && endSeqNo == 0)
      || (beginString <= FIX::BeginString_FIX42 && endSeqNo == 999999) || (endSeqNo >= getExpectedSenderNum())) {
    endSeqNo = getExpectedSenderNum() - 1;
  }

  if (!m_persistMessages) {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    auto next = m_state.getNextSenderMsgSeqNum();
    if (endSeqNo > next) {
      endSeqNo = EndSeqNo(next);
    }
    generateSequenceReset(beginSeqNo, endSeqNo);
  } else {
    generateRetransmits(beginSeqNo.getValue(), endSeqNo.getValue());
  }

  MsgSeqNum msgSeqNum(0);
  resendRequest.getHeader().getField(msgSeqNum);
  if (!isTargetTooHigh(msgSeqNum) && !isTargetTooLow(msgSeqNum)) {
    m_state.incrNextTargetMsgSeqNum();
  }
}